

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ModelDescription::ModelDescription
          (ModelDescription *this,Arena *arena,bool is_message_owned)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004be5f0;
  google::protobuf::internal::InternalMetadata::InternalMetadata
            (&(this->super_MessageLite)._internal_metadata_,arena,is_message_owned);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ModelDescription_004b3890;
  (this->input_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->input_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->input_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->input_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->output_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->output_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->output_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->output_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->state_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->state_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->state_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->state_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->functions_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->functions_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->functions_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->functions_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->traininginput_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->traininginput_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->traininginput_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->traininginput_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  (this->predictedfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->predictedprobabilitiesname_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->defaultfunctionname_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->metadata_ = (Metadata *)0x0;
  return;
}

Assistant:

ModelDescription::ModelDescription(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena, is_message_owned),
  input_(arena),
  output_(arena),
  state_(arena),
  functions_(arena),
  traininginput_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:CoreML.Specification.ModelDescription)
}